

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void promise_reaction_data_free(JSRuntime *rt,JSPromiseReactionData *rd)

{
  int *piVar1;
  int iVar2;
  JSValue JVar3;
  
  piVar1 = (int *)rd->resolving_funcs[0].u.ptr;
  JVar3 = rd->resolving_funcs[0];
  if ((0xfffffff4 < (uint)rd->resolving_funcs[0].tag) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar3);
  }
  piVar1 = (int *)rd->resolving_funcs[1].u.ptr;
  JVar3 = rd->resolving_funcs[1];
  if ((0xfffffff4 < (uint)rd->resolving_funcs[1].tag) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar3);
  }
  piVar1 = (int *)(rd->handler).u.ptr;
  JVar3 = rd->handler;
  if ((0xfffffff4 < (uint)(rd->handler).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2))
  {
    __JS_FreeValueRT(rt,JVar3);
  }
  (*(rt->mf).js_free)(&rt->malloc_state,rd);
  return;
}

Assistant:

static void promise_reaction_data_free(JSRuntime *rt,
                                       JSPromiseReactionData *rd)
{
    JS_FreeValueRT(rt, rd->resolving_funcs[0]);
    JS_FreeValueRT(rt, rd->resolving_funcs[1]);
    JS_FreeValueRT(rt, rd->handler);
    js_free_rt(rt, rd);
}